

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.h
# Opt level: O0

void __thiscall HFactor::rlinkAdd(HFactor *this,HighsInt index,HighsInt count)

{
  int iVar1;
  reference pvVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  HighsInt mover;
  
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x420),(long)in_EDX);
  iVar1 = *pvVar2;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x450),(long)in_ESI);
  *pvVar2 = -2 - in_EDX;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x438),(long)in_ESI);
  *pvVar2 = iVar1;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x420),(long)in_EDX);
  *pvVar2 = in_ESI;
  if (-1 < iVar1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x450),(long)iVar1);
    *pvVar2 = in_ESI;
  }
  return;
}

Assistant:

void rlinkAdd(const HighsInt index, const HighsInt count) {
    const HighsInt mover = row_link_first[count];
    row_link_last[index] = -2 - count;
    row_link_next[index] = mover;
    row_link_first[count] = index;
    if (mover >= 0) row_link_last[mover] = index;
  }